

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.hpp
# Opt level: O1

RenderbufferAttachment * __thiscall
deqp::gls::FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::RenderbufferAttachment>
          (FboBuilder *this)

{
  RenderbufferAttachment *pRVar1;
  RenderbufferAttachment *local_18;
  
  pRVar1 = (RenderbufferAttachment *)operator_new(0x18);
  (pRVar1->super_Attachment).target = 0x8d40;
  (pRVar1->super_Attachment).imageName = 0;
  (pRVar1->super_Attachment).super_Config._vptr_Config = (_func_int **)&PTR__Config_0218fc30;
  pRVar1->renderbufferTarget = 0x8d41;
  local_18 = pRVar1;
  std::
  _Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
  ::_M_insert_unique<deqp::gls::FboUtil::config::Config*>
            ((_Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
              *)&this->m_configs,(Config **)&local_18);
  return pRVar1;
}

Assistant:

Config&						makeConfig		(void)
	{
		Config* cfg = new Config();
		m_configs.insert(cfg);
		return *cfg;
	}